

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  uint uVar1;
  undefined8 *data;
  void *p;
  char *pKey;
  
  if (zName == (char *)0x0) {
    return db->pDfltColl;
  }
  data = (undefined8 *)sqlite3HashFind(&db->aCollSeq,zName);
  if (create == 0 || data != (undefined8 *)0x0) {
    if (data != (undefined8 *)0x0) {
LAB_00152a8b:
      return (CollSeq *)(data + (ulong)enc * 5 + -5);
    }
  }
  else {
    uVar1 = sqlite3Strlen30(zName);
    data = (undefined8 *)sqlite3DbMallocZero(db,(ulong)uVar1 + 0x79);
    if (data != (undefined8 *)0x0) {
      pKey = (char *)(data + 0xf);
      *data = pKey;
      *(undefined1 *)(data + 1) = 1;
      data[5] = pKey;
      *(undefined1 *)(data + 6) = 2;
      data[10] = pKey;
      *(undefined1 *)(data + 0xb) = 3;
      memcpy(pKey,zName,(ulong)uVar1 + 1);
      p = sqlite3HashInsert(&db->aCollSeq,pKey,data);
      if (p == (void *)0x0) goto LAB_00152a8b;
      sqlite3OomFault(db);
      sqlite3DbFreeNN(db,p);
    }
  }
  return (CollSeq *)0x0;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,          /* Database connection to search */
  u8 enc,               /* Desired text encoding */
  const char *zName,    /* Name of the collating sequence.  Might be NULL */
  int create            /* True to create CollSeq if doesn't already exist */
){
  CollSeq *pColl;
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
    if( pColl ) pColl += enc-1;
  }else{
    pColl = db->pDfltColl;
  }
  return pColl;
}